

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

uint8 * __thiscall
bloaty::CustomDataSource::InternalSerializeWithCachedSizesToArray
          (CustomDataSource *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  void *pvVar4;
  Type *this_00;
  uint8 *puVar5;
  int index;
  uint8 *local_40;
  CustomDataSource *local_38;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  local_40 = target;
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "bloaty.CustomDataSource.name");
    local_40 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,1,(this->name_).ptr_,target);
  }
  puVar5 = local_40;
  if ((uVar1 & 2) != 0) {
    psVar3 = (this->base_data_source_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "bloaty.CustomDataSource.base_data_source");
    local_40 = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,2,(this->base_data_source_).ptr_,puVar5);
  }
  iVar2 = (this->rewrite_).super_RepeatedPtrFieldBase.current_size_;
  local_38 = this;
  for (index = 0; iVar2 != index; index = index + 1) {
    google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<bloaty::Regex>::TypeHandler>
                        (&(this->rewrite_).super_RepeatedPtrFieldBase,index);
    *local_40 = '\x1a';
    puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = Regex::InternalSerializeWithCachedSizesToArray(this_00,puVar5,stream);
  }
  pvVar4 = (local_38->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    local_40 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),local_40,stream);
  }
  return local_40;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* CustomDataSource::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:bloaty.CustomDataSource)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.CustomDataSource.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string base_data_source = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_base_data_source().data(), static_cast<int>(this->_internal_base_data_source().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.CustomDataSource.base_data_source");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_base_data_source(), target);
  }

  // repeated .bloaty.Regex rewrite = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_rewrite_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(3, this->_internal_rewrite(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:bloaty.CustomDataSource)
  return target;
}